

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O3

void __thiscall MyClientConnection::OnClose(MyClientConnection *this,SDKJsonResult *reason)

{
  ostringstream *poVar1;
  pointer pcVar2;
  OutputWorker *pOVar3;
  pointer psVar4;
  TonkStatus status;
  vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
  connections;
  TonkStatus cs;
  uint8_t data [5];
  TonkStatus local_208;
  vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
  local_1e8;
  TonkStatus local_1d0;
  undefined1 local_1b8 [392];
  
  pcVar2 = (reason->ErrorJson)._M_dataplus._M_p;
  local_208._0_8_ = &local_208.LowPriQueueMsec;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar2,pcVar2 + (reason->ErrorJson)._M_string_length);
  if ((int)Logger.ChannelMinLevel < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger.ChannelName;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"MyServerConnection: OnClose(",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_208._0_8_,local_208._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((uint32_t *)local_208._0_8_ != &local_208.LowPriQueueMsec) {
    operator_delete((void *)local_208._0_8_);
  }
  test::LogTonkStatus(&this->super_SDKConnection);
  tonk::SDKConnection::GetStatus(&local_208,&this->super_SDKConnection);
  tonk::SDKConnectionList<MyClientConnection>::GetList(&local_1e8,&this->Client->ClientList);
  if (local_1e8.
      super__Vector_base<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1e8.
      super__Vector_base<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    psVar4 = local_1e8.
             super__Vector_base<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      tonk::SDKConnection::GetStatus
                (&local_1d0,
                 &((psVar4->super___shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_SDKConnection);
      if ((int)Logger.ChannelMinLevel < 3) {
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Informing connection ",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," about ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," disconnecting",0xe);
        pOVar3 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      local_1b8._1_4_ = local_208.LocallyAssignedIdForRemoteHost;
      local_1b8[0] = 4;
      tonk::SDKConnection::Send(&this->super_SDKConnection,(LogStringBuffer *)local_1b8,5,0x32);
      psVar4 = psVar4 + 1;
    } while (psVar4 != local_1e8.
                       super__Vector_base<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<MyClientConnection>,_std::allocator<std::shared_ptr<MyClientConnection>_>_>
  ::~vector(&local_1e8);
  return;
}

Assistant:

void MyClientConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    Logger.Info("MyServerConnection: OnClose(", reason.ToString(), ")");

    LogTonkStatus(this);

    TonkStatus status = GetStatus();

    auto connections = Client->ClientList.GetList();
    for (auto& connection : connections)
    {
        TonkStatus cs = connection->GetStatus();
        Logger.Info("Informing connection ", cs.LocallyAssignedIdForRemoteHost, " about ", status.LocallyAssignedIdForRemoteHost, " disconnecting");

        uint8_t data[1 + 4];
        data[0] = ID_ConnectionRemoved;
        tonk::WriteU32_LE(data + 1, status.LocallyAssignedIdForRemoteHost);
        Send(data, sizeof(data), TonkChannel_Reliable0);
    }
}